

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O0

void __thiscall
PageStack<Memory::MarkContext::MarkCandidate>::Abort
          (PageStack<Memory::MarkContext::MarkCandidate> *this)

{
  Chunk *chunk;
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  Chunk *temp;
  PageStack<Memory::MarkContext::MarkCandidate> *this_local;
  
  if (this->currentChunk == (Chunk *)0x0) {
    if (this->count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x16e,"(count == 0)","count == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
  }
  else {
    while (this->currentChunk->nextChunk != (Chunk *)0x0) {
      chunk = this->currentChunk;
      this->currentChunk = this->currentChunk->nextChunk;
      FreeChunk(this,chunk);
    }
    this->chunkStart = (MarkCandidate *)(this->currentChunk + 1);
    this->chunkEnd = (MarkCandidate *)(this->currentChunk + 0x80);
    this->nextEntry = this->chunkStart;
    this->count = 0;
  }
  return;
}

Assistant:

void PageStack<T>::Abort()
{
    // Abandon the current entries in the stack and reset to initialized state.

    if (currentChunk == nullptr)
    {
        Assert(count == 0);
        return;
    }

    // Free all the chunks except the first one
    while (currentChunk->nextChunk != nullptr)
    {
        Chunk * temp = currentChunk;
        currentChunk = currentChunk->nextChunk;
        FreeChunk(temp);
    }

    chunkStart = currentChunk->entries;
    chunkEnd = &currentChunk->entries[EntriesPerChunk];
    nextEntry = chunkStart;

#if DBG
    count = 0;
#endif
}